

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Client::~Client(Client *this)

{
  this->_vptr_Client = (_func_int **)&PTR__Client_00186270;
  std::__cxx11::string::~string((string *)&this->host_and_port_);
  std::__cxx11::string::~string((string *)&this->host_);
  return;
}

Assistant:

inline Client::~Client()
{
}